

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O3

int __thiscall anon_unknown.dwarf_2a7d7c::WaveBackend::mixerProc(WaveBackend *this)

{
  uint uVar1;
  ALuint AVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  ALCdevice *pAVar12;
  ulong uVar13;
  long local_60;
  uint local_48;
  timespec local_40;
  
  pAVar12 = (this->super_BackendBase).mDevice;
  uVar1 = pAVar12->Frequency;
  AVar2 = pAVar12->UpdateSize;
  althrd_setname("alsoft-mixer");
  pAVar12 = (this->super_BackendBase).mDevice;
  uVar4 = ChannelsFromDevFmt(pAVar12->FmtChans,pAVar12->mAmbiOrder);
  pAVar12 = (this->super_BackendBase).mDevice;
  uVar5 = BytesFromDevFmt(pAVar12->FmtType);
  uVar6 = ChannelsFromDevFmt(pAVar12->FmtChans,pAVar12->mAmbiOrder);
  local_60 = std::chrono::_V2::steady_clock::now();
  if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
    uVar3 = (ulong)(AVar2 * 1000) / (ulong)uVar1;
    uVar13 = 0;
    do {
      if (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) {
        return 0;
      }
      lVar8 = std::chrono::_V2::steady_clock::now();
      pAVar12 = (this->super_BackendBase).mDevice;
      lVar8 = (long)((lVar8 - local_60) * (ulong)pAVar12->Frequency) / 1000000000;
      if ((long)(lVar8 - uVar13) < (long)(ulong)pAVar12->UpdateSize) {
        local_48 = (uint)uVar3;
        uVar11 = uVar3 / 2000;
        lVar8 = ((uVar3 / 2000) * -1000 + (uVar3 >> 1)) * 1000000;
        if (1 < local_48) {
          do {
            local_40.tv_nsec = lVar8;
            local_40.tv_sec = uVar11;
            iVar7 = nanosleep(&local_40,&local_40);
            if (iVar7 != -1) break;
            piVar9 = __errno_location();
            uVar11 = local_40.tv_sec;
            lVar8 = local_40.tv_nsec;
          } while (*piVar9 == 4);
        }
      }
      else {
        do {
          pAVar12 = (this->super_BackendBase).mDevice;
          if ((long)(lVar8 - uVar13) < (long)(ulong)pAVar12->UpdateSize) goto LAB_0016b310;
          ALCdevice::renderSamples
                    (pAVar12,(this->mBuffer).
                             super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                             super__Vector_impl_data._M_start,pAVar12->UpdateSize,(ulong)uVar4);
          uVar11 = (ulong)((this->super_BackendBase).mDevice)->UpdateSize;
          uVar13 = uVar13 + uVar11;
          fwrite((this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl
                 .super__Vector_impl_data._M_start,(ulong)(uVar6 * uVar5),uVar11,(FILE *)this->mFile
                );
          iVar7 = ferror((FILE *)this->mFile);
        } while (iVar7 == 0);
        if (0 < (int)gLogLevel) {
          _GLOBAL__N_1::WaveBackend::mixerProc();
        }
        ALCdevice::handleDisconnect
                  ((this->super_BackendBase).mDevice,"Failed to write playback samples");
        pAVar12 = (this->super_BackendBase).mDevice;
LAB_0016b310:
        uVar11 = (ulong)pAVar12->Frequency;
        if ((long)uVar11 <= (long)uVar13) {
          uVar10 = uVar13 / uVar11;
          uVar13 = uVar13 % uVar11;
          local_60 = local_60 + uVar10 * 1000000000;
        }
      }
    } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
  }
  return 0;
}

Assistant:

int WaveBackend::mixerProc()
{
    const milliseconds restTime{mDevice->UpdateSize*1000/mDevice->Frequency / 2};

    althrd_setname(MIXER_THREAD_NAME);

    const size_t frameStep{mDevice->channelsFromFmt()};
    const ALuint frameSize{mDevice->frameSizeFromFmt()};

    int64_t done{0};
    auto start = std::chrono::steady_clock::now();
    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        auto now = std::chrono::steady_clock::now();

        /* This converts from nanoseconds to nanosamples, then to samples. */
        int64_t avail{std::chrono::duration_cast<seconds>((now-start) *
            mDevice->Frequency).count()};
        if(avail-done < mDevice->UpdateSize)
        {
            std::this_thread::sleep_for(restTime);
            continue;
        }
        while(avail-done >= mDevice->UpdateSize)
        {
            mDevice->renderSamples(mBuffer.data(), mDevice->UpdateSize, frameStep);
            done += mDevice->UpdateSize;

            if /*constexpr*/(!IS_LITTLE_ENDIAN)
            {
                const ALuint bytesize{mDevice->bytesFromFmt()};

                if(bytesize == 2)
                {
                    ALushort *samples = reinterpret_cast<ALushort*>(mBuffer.data());
                    const size_t len{mBuffer.size() / 2};
                    for(size_t i{0};i < len;i++)
                    {
                        const ALushort samp{samples[i]};
                        samples[i] = static_cast<ALushort>((samp>>8) | (samp<<8));
                    }
                }
                else if(bytesize == 4)
                {
                    ALuint *samples = reinterpret_cast<ALuint*>(mBuffer.data());
                    const size_t len{mBuffer.size() / 4};
                    for(size_t i{0};i < len;i++)
                    {
                        const ALuint samp{samples[i]};
                        samples[i] = (samp>>24) | ((samp>>8)&0x0000ff00) |
                                     ((samp<<8)&0x00ff0000) | (samp<<24);
                    }
                }
            }

            size_t fs{fwrite(mBuffer.data(), frameSize, mDevice->UpdateSize, mFile)};
            (void)fs;
            if(ferror(mFile))
            {
                ERR("Error writing to file\n");
                mDevice->handleDisconnect("Failed to write playback samples");
                break;
            }
        }

        /* For every completed second, increment the start time and reduce the
         * samples done. This prevents the difference between the start time
         * and current time from growing too large, while maintaining the
         * correct number of samples to render.
         */
        if(done >= mDevice->Frequency)
        {
            seconds s{done/mDevice->Frequency};
            start += s;
            done -= mDevice->Frequency*s.count();
        }
    }

    return 0;
}